

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_entry.hpp
# Opt level: O2

void __thiscall
asio::ip::basic_resolver_entry<asio::ip::tcp>::basic_resolver_entry
          (basic_resolver_entry<asio::ip::tcp> *this,endpoint_type *ep,string *host,string *service)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  uVar1 = *(undefined8 *)&(ep->impl_).data_;
  uVar2 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
  uVar3 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x14);
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 0xc) =
       *(undefined8 *)((long)&(ep->impl_).data_ + 0xc);
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 0x14) = uVar3;
  *(undefined8 *)&(this->endpoint_).impl_.data_ = uVar1;
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 8) = uVar2;
  std::__cxx11::string::string((string *)&this->host_name_,(string *)host);
  std::__cxx11::string::string((string *)&this->service_name_,(string *)service);
  return;
}

Assistant:

basic_resolver_entry(const endpoint_type& ep,
      const std::string& host, const std::string& service)
    : endpoint_(ep),
      host_name_(host),
      service_name_(service)
  {
  }